

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeInstructions::optimizeMemoryAccess
          (OptimizeInstructions *this,Expression **ptr,Address *offset,Name memory)

{
  Name name;
  Memory *pMVar1;
  uint64_t uVar2;
  bool bVar3;
  int iVar4;
  Module *this_00;
  ulong uVar5;
  Literal local_a8;
  Literal local_80;
  unsigned_long local_68;
  uint64_t sum;
  size_t local_58;
  Memory *local_50;
  Memory *mem;
  uint64_t offset64;
  uint64_t value64;
  Const *last;
  Address *offset_local;
  Expression **ptr_local;
  OptimizeInstructions *this_local;
  Name memory_local;
  
  memory_local.super_IString.str._M_len = memory.super_IString.str._M_str;
  this_local = memory.super_IString.str._M_len;
  last = (Const *)offset;
  offset_local = (Address *)ptr;
  ptr_local = (Expression **)this;
  value64 = (uint64_t)Expression::dynCast<wasm::Const>(*ptr);
  if ((Const *)value64 != (Const *)0x0) {
    offset64 = wasm::Literal::getInteger(&((Const *)value64)->value);
    mem = (Memory *)wasm::Address::operator_cast_to_unsigned_long((Address *)last);
    this_00 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
              getModule(&(this->
                         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                         ).
                         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                         .
                         super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                       );
    sum = (uint64_t)this_local;
    local_58 = memory_local.super_IString.str._M_len;
    name.super_IString.str._M_str = (char *)memory_local.super_IString.str._M_len;
    name.super_IString.str._M_len = (size_t)this_local;
    local_50 = Module::getMemory(this_00,name);
    bVar3 = Memory::is64(local_50);
    uVar2 = offset64;
    if (bVar3) {
      bVar3 = std::ckd_add<unsigned_long>(&local_68,offset64,(unsigned_long)mem);
      if (!bVar3) {
        wasm::Literal::Literal(&local_80,local_68);
        wasm::Literal::operator=((Literal *)(value64 + 0x10),&local_80);
        wasm::Literal::~Literal(&local_80);
        wasm::Address::operator=((Address *)last,0);
      }
    }
    else {
      iVar4 = std::numeric_limits<int>::max();
      pMVar1 = mem;
      if (((uVar2 <= (ulong)(long)iVar4) &&
          (iVar4 = std::numeric_limits<int>::max(), pMVar1 <= (Memory *)(long)iVar4)) &&
         (uVar5 = (long)&(mem->super_Importable).super_Named.name.super_IString.str._M_len +
                  offset64, iVar4 = std::numeric_limits<int>::max(), uVar5 <= (ulong)(long)iVar4)) {
        wasm::Literal::Literal(&local_a8,(int)offset64 + (int)mem);
        wasm::Literal::operator=((Literal *)(value64 + 0x10),&local_a8);
        wasm::Literal::~Literal(&local_a8);
        wasm::Address::operator=((Address *)last,0);
      }
    }
  }
  return;
}

Assistant:

void optimizeMemoryAccess(Expression*& ptr, Address& offset, Name memory) {
    // ptr may be a const, but it isn't worth folding that in (we still have a
    // const); in fact, it's better to do the opposite for gzip purposes as well
    // as for readability.
    auto* last = ptr->dynCast<Const>();
    if (last) {
      uint64_t value64 = last->value.getInteger();
      uint64_t offset64 = offset;
      auto mem = getModule()->getMemory(memory);
      if (mem->is64()) {
        // Check for a 64-bit overflow.
        uint64_t sum;
        if (!std::ckd_add(&sum, value64, offset64)) {
          last->value = Literal(int64_t(sum));
          offset = 0;
        }
      } else {
        // don't do this if it would wrap the pointer
        if (value64 <= uint64_t(std::numeric_limits<int32_t>::max()) &&
            offset64 <= uint64_t(std::numeric_limits<int32_t>::max()) &&
            value64 + offset64 <=
              uint64_t(std::numeric_limits<int32_t>::max())) {
          last->value = Literal(int32_t(value64 + offset64));
          offset = 0;
        }
      }
    }
  }